

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O2

bool CoreML::Specification::operator==(ItemSimilarityRecommender *a,ItemSimilarityRecommender *b)

{
  bool bVar1;
  _ItemSimilarityRecommenderData local_2c0;
  _ItemSimilarityRecommenderData local_168;
  
  Recommender::_ItemSimilarityRecommenderData::_ItemSimilarityRecommenderData(&local_168,a);
  Recommender::_ItemSimilarityRecommenderData::_ItemSimilarityRecommenderData(&local_2c0,b);
  bVar1 = Recommender::_ItemSimilarityRecommenderData::operator==(&local_168,&local_2c0);
  Recommender::_ItemSimilarityRecommenderData::~_ItemSimilarityRecommenderData(&local_2c0);
  Recommender::_ItemSimilarityRecommenderData::~_ItemSimilarityRecommenderData(&local_168);
  return bVar1;
}

Assistant:

bool operator==(const ItemSimilarityRecommender& a,
                        const ItemSimilarityRecommender& b) {
            try {
               return (Recommender::_ItemSimilarityRecommenderData(a)
                       == Recommender::_ItemSimilarityRecommenderData(b));
            } catch(const std::invalid_argument&) {
                return false;
            }
        }